

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O3

Element * __thiscall
Rml::ElementDocument::FindNextTabElement
          (ElementDocument *this,Element *current_element,bool forward)

{
  int iVar1;
  CanFocus CVar2;
  Element *pEVar3;
  ElementDocument *element;
  ElementDocument *this_00;
  ElementDocument *pEVar4;
  undefined7 in_register_00000011;
  int iVar5;
  ElementDocument *pEVar6;
  int iVar7;
  bool bVar8;
  
  if ((int)CONCAT71(in_register_00000011,forward) != 0) {
    iVar5 = 0;
    iVar1 = Element::GetNumChildren(current_element,false);
    if (0 < iVar1) {
      do {
        pEVar3 = Element::GetChild(current_element,iVar5);
        pEVar3 = SearchFocusSubtree(this,pEVar3,true);
        if (pEVar3 != (Element *)0x0) {
          return pEVar3;
        }
        iVar5 = iVar5 + 1;
        iVar1 = Element::GetNumChildren(current_element,false);
      } while (iVar5 < iVar1);
    }
  }
  element = Element::GetOwnerDocument(current_element);
  this_00 = (ElementDocument *)Element::GetParentNode(current_element);
  pEVar6 = (ElementDocument *)current_element;
  if (element != (ElementDocument *)current_element) {
    do {
      iVar1 = Element::GetNumChildren(&this_00->super_Element,false);
      if (0 < iVar1) {
        bVar8 = false;
        iVar5 = 0;
        do {
          iVar1 = iVar1 + -1;
          iVar7 = iVar1;
          if (forward) {
            iVar7 = iVar5;
          }
          pEVar4 = (ElementDocument *)Element::GetChild(&this_00->super_Element,iVar7);
          if ((bVar8) &&
             (pEVar3 = SearchFocusSubtree(this,(Element *)pEVar4,forward), pEVar3 != (Element *)0x0)
             ) {
            return pEVar3;
          }
          bVar8 = (bool)(bVar8 | pEVar4 == pEVar6);
          iVar5 = iVar5 + 1;
        } while (iVar1 != 0);
      }
      pEVar4 = (ElementDocument *)Element::GetParentNode(&this_00->super_Element);
      bVar8 = this_00 != element;
      pEVar6 = this_00;
      this_00 = pEVar4;
    } while (bVar8);
    if ((element != (ElementDocument *)current_element) &&
       (CVar2 = anon_unknown_0::CanFocusElement(&element->super_Element), CVar2 == Yes)) {
      return &element->super_Element;
    }
  }
  iVar1 = Element::GetNumChildren(&element->super_Element,false);
  if (0 < iVar1) {
    iVar5 = 0;
    do {
      iVar1 = iVar1 + -1;
      iVar7 = iVar1;
      if (forward) {
        iVar7 = iVar5;
      }
      pEVar3 = Element::GetChild(&element->super_Element,iVar7);
      pEVar3 = SearchFocusSubtree(this,pEVar3,forward);
      if (pEVar3 != (Element *)0x0) {
        return pEVar3;
      }
      iVar5 = iVar5 + 1;
    } while (iVar1 != 0);
  }
  return (Element *)0x0;
}

Assistant:

Element* ElementDocument::FindNextTabElement(Element* current_element, bool forward)
{
	// This algorithm is quite sneaky, I originally thought a depth first search would work, but it appears not. What is
	// required is to cut the tree in half along the nodes from current_element up the root and then either traverse the
	// tree in a clockwise or anticlock wise direction depending if you're searching forward or backward respectively.

	// If we're searching forward, check the immediate children of this node first off.
	if (forward)
	{
		for (int i = 0; i < current_element->GetNumChildren(); i++)
			if (Element* result = SearchFocusSubtree(current_element->GetChild(i), forward))
				return result;
	}

	// Now walk up the tree, testing either the bottom or top
	// of the tree, depending on whether we're going forward
	// or backward respectively.
	bool search_enabled = false;
	Element* document = current_element->GetOwnerDocument();
	Element* child = current_element;
	Element* parent = current_element->GetParentNode();
	while (child != document)
	{
		const int num_children = parent->GetNumChildren();
		for (int i = 0; i < num_children; i++)
		{
			// Calculate index into children
			const int child_index = forward ? i : (num_children - i - 1);
			Element* search_child = parent->GetChild(child_index);

			// Do a search if its enabled
			if (search_enabled)
				if (Element* result = SearchFocusSubtree(search_child, forward))
					return result;

			// Enable searching when we reach the child.
			if (search_child == child)
				search_enabled = true;
		}

		// Advance up the tree
		child = parent;
		parent = parent->GetParentNode();
		search_enabled = false;
	}

	// We could not find anything to focus along this direction.

	// If we can focus the document, then focus that now.
	if (current_element != document && CanFocusElement(document) == CanFocus::Yes)
		return document;

	// Otherwise, search the entire document tree. This way we will wrap around.
	const int num_children = document->GetNumChildren();
	for (int i = 0; i < num_children; i++)
	{
		const int child_index = forward ? i : (num_children - i - 1);
		if (Element* result = SearchFocusSubtree(document->GetChild(child_index), forward))
			return result;
	}

	return nullptr;
}